

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_cpu_cpp:84:5)_&>
* testing::internal::
  MatcherCastImpl<const_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp:84:5)_&,_testing::PolymorphicMatcher<testing::internal::ExceptionMatcherImpl<std::logic_error>_>_>
  ::Cast(Matcher<const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_johnor[P]n_e_s_vis_build_O0__deps_nes_core_src_core_test_src_test_cpu_cpp:84:5)_&>
         *__return_storage_ptr__,
        PolymorphicMatcher<testing::internal::ExceptionMatcherImpl<std::logic_error>_>
        *polymorphic_matcher_or_value)

{
  PolymorphicMatcher<testing::internal::ExceptionMatcherImpl<std::logic_error>_>
  *polymorphic_matcher_or_value_local;
  
  CastImpl<false>(__return_storage_ptr__,polymorphic_matcher_or_value);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> Cast(const M& polymorphic_matcher_or_value) {
    // M can be a polymorphic matcher, in which case we want to use
    // its conversion operator to create Matcher<T>.  Or it can be a value
    // that should be passed to the Matcher<T>'s constructor.
    //
    // We can't call Matcher<T>(polymorphic_matcher_or_value) when M is a
    // polymorphic matcher because it'll be ambiguous if T has an implicit
    // constructor from M (this usually happens when T has an implicit
    // constructor from any type).
    //
    // It won't work to unconditionally implicit_cast
    // polymorphic_matcher_or_value to Matcher<T> because it won't trigger
    // a user-defined conversion from M to T if one exists (assuming M is
    // a value).
    return CastImpl(polymorphic_matcher_or_value,
                    std::is_convertible<M, Matcher<T>>{},
                    std::is_convertible<M, T>{});
  }